

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeRTASParallelOperationDestroyExp
          (ze_rtas_parallel_operation_exp_handle_t hParallelOperation)

{
  _ze_rtas_parallel_operation_exp_handle_t *_key;
  ze_pfnRTASParallelOperationDestroyExp_t pfnDestroyExp;
  dditable_t *dditable;
  ze_result_t result;
  ze_rtas_parallel_operation_exp_handle_t hParallelOperation_local;
  
  if (*(code **)(*(long *)(hParallelOperation + 8) + 0x80) == (code *)0x0) {
    hParallelOperation_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    _key = *(_ze_rtas_parallel_operation_exp_handle_t **)hParallelOperation;
    hParallelOperation_local._4_4_ = (**(code **)(*(long *)(hParallelOperation + 8) + 0x80))(_key);
    if (hParallelOperation_local._4_4_ == ZE_RESULT_SUCCESS) {
      singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
      ::release((singleton_factory_t<object_t<_ze_rtas_parallel_operation_exp_handle_t_*>,__ze_rtas_parallel_operation_exp_handle_t_*>
                 *)(context + 0x6c0),_key);
    }
  }
  return hParallelOperation_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeRTASParallelOperationDestroyExp(
        ze_rtas_parallel_operation_exp_handle_t hParallelOperation  ///< [in][release] handle of parallel operation object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_rtas_parallel_operation_exp_object_t*>( hParallelOperation )->dditable;
        auto pfnDestroyExp = dditable->ze.RTASParallelOperationExp.pfnDestroyExp;
        if( nullptr == pfnDestroyExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hParallelOperation = reinterpret_cast<ze_rtas_parallel_operation_exp_object_t*>( hParallelOperation )->handle;

        // forward to device-driver
        result = pfnDestroyExp( hParallelOperation );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        // release loader handle
        context->ze_rtas_parallel_operation_exp_factory.release( hParallelOperation );

        return result;
    }